

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O3

int mbedtls_ecdh_calc_secret
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *z;
  ulong uVar1;
  int iVar2;
  mbedtls_ecp_curve_type mVar3;
  size_t sVar4;
  
  iVar2 = -0x4f80;
  if ((ctx != (mbedtls_ecdh_context *)0x0) && ((ctx->grp).pbits != 0)) {
    z = &ctx->z;
    iVar2 = mbedtls_ecdh_compute_shared(&ctx->grp,z,&ctx->Qp,&ctx->d,f_rng,p_rng);
    if (iVar2 == 0) {
      sVar4 = mbedtls_mpi_size(z);
      iVar2 = -0x4f80;
      if (sVar4 <= blen) {
        uVar1 = (ctx->grp).pbits;
        *olen = ((uVar1 >> 3) + 1) - (ulong)((uVar1 & 7) == 0);
        mVar3 = mbedtls_ecp_get_type(&ctx->grp);
        if (mVar3 == MBEDTLS_ECP_TYPE_MONTGOMERY) {
          iVar2 = mbedtls_mpi_write_binary_le(z,buf,*olen);
          return iVar2;
        }
        iVar2 = mbedtls_mpi_write_binary(z,buf,*olen);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdh_calc_secret( mbedtls_ecdh_context *ctx, size_t *olen,
                              unsigned char *buf, size_t blen,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng )
{
    int restart_enabled = 0;
    ECDH_VALIDATE_RET( ctx != NULL );
    ECDH_VALIDATE_RET( olen != NULL );
    ECDH_VALIDATE_RET( buf != NULL );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    restart_enabled = ctx->restart_enabled;
#endif

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return( ecdh_calc_secret_internal( ctx, olen, buf, blen, f_rng, p_rng,
                                       restart_enabled ) );
#else
    switch( ctx->var )
    {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            return( mbedtls_everest_calc_secret( &ctx->ctx.everest_ecdh, olen,
                                                 buf, blen, f_rng, p_rng ) );
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return( ecdh_calc_secret_internal( &ctx->ctx.mbed_ecdh, olen, buf,
                                               blen, f_rng, p_rng,
                                               restart_enabled ) );
        default:
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }
#endif
}